

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

void Abc_NtkMiterReport(Abc_Ntk_t *pMiter)

{
  uint uVar1;
  long *plVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  undefined8 *puVar6;
  char *__s;
  ulong uVar7;
  
  if (pMiter->vPos->nSize == 1) {
    plVar2 = (long *)*pMiter->vPos->pArray;
    uVar7 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
    puVar6 = (undefined8 *)(uVar7 & 0xfffffffffffffffe);
    if (*(int *)*puVar6 == 3) {
      pcVar5 = "Unsatisfiable.";
      if ((((uint)uVar7 ^ *(uint *)((long)plVar2 + 0x14) >> 10) & 1) == 0) {
        pcVar5 = "Satisfiable. (Constant 1).";
      }
      __s = "Satisfiable.";
      if ((*(uint *)((long)puVar6 + 0x14) & 0xf) == 1) {
        __s = pcVar5;
      }
      puts(__s);
      return;
    }
LAB_002d660a:
    __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                  ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
  }
  pVVar4 = pMiter->vPos;
  if (0 < pVVar4->nSize) {
    uVar7 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[uVar7];
      uVar3 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      uVar1 = *(uint *)((long)plVar2 + 0x14);
      printf("Output #%2d : ",uVar7 & 0xffffffff);
      puVar6 = (undefined8 *)(uVar3 & 0xfffffffffffffffe);
      if (*(int *)*puVar6 != 3) goto LAB_002d660a;
      pcVar5 = "Unsatisfiable.";
      if ((((uint)uVar3 ^ uVar1 >> 10) & 1) == 0) {
        pcVar5 = "Satisfiable. (Constant 1).";
      }
      if ((*(uint *)((long)puVar6 + 0x14) & 0xf) != 1) {
        pcVar5 = "Satisfiable.";
      }
      puts(pcVar5);
      uVar7 = uVar7 + 1;
      pVVar4 = pMiter->vPos;
    } while ((long)uVar7 < (long)pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkMiterReport( Abc_Ntk_t * pMiter )
{
    Abc_Obj_t * pChild, * pNode;
    int i;
    if ( Abc_NtkPoNum(pMiter) == 1 )
    {
        pChild = Abc_ObjChild0( Abc_NtkPo(pMiter,0) );
        if ( Abc_AigNodeIsConst(pChild) )
        {
            if ( Abc_ObjIsComplement(pChild) )
                printf( "Unsatisfiable.\n" );
            else
                printf( "Satisfiable. (Constant 1).\n" );
        }
        else
            printf( "Satisfiable.\n" );
    }
    else
    {
        Abc_NtkForEachPo( pMiter, pNode, i )
        {
            pChild = Abc_ObjChild0( Abc_NtkPo(pMiter,i) );
            printf( "Output #%2d : ", i );
            if ( Abc_AigNodeIsConst(pChild) )
            {
                if ( Abc_ObjIsComplement(pChild) )
                    printf( "Unsatisfiable.\n" );
                else
                    printf( "Satisfiable. (Constant 1).\n" );
            }
            else
                printf( "Satisfiable.\n" );
        }
    }
}